

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void google::protobuf::internal::PackedFieldHelper<1>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  double *pdVar1;
  double *pdVar2;
  int index;
  RepeatedField<double> *array;
  uint32_t local_20;
  undefined4 local_1c;
  
  if (*field != 0) {
    local_20 = md->tag;
    OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_20,output);
    local_1c = *(undefined4 *)((long)field + 0x10);
    OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_1c,output);
    if (0 < *field) {
      index = 0;
      do {
        pdVar2 = RepeatedField<double>::Get((RepeatedField<double> *)field,index);
        pdVar1 = (double *)output->ptr;
        *pdVar1 = *pdVar2;
        output->ptr = (uint8_t *)(pdVar1 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}